

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessTools.cxx
# Opt level: O3

void cmProcessTools::RunProcess
               (cmsysProcess_s *cp,OutputParser *out,OutputParser *err,Encoding encoding)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  cmProcessOutput local_9d;
  int local_9c;
  string local_98;
  char *local_78;
  string local_70;
  string local_50;
  
  cmsysProcess_Execute(cp);
  local_78 = (char *)0x0;
  local_9c = 0;
  cmProcessOutput::cmProcessOutput(&local_9d,encoding,0x400);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  bVar2 = out != (OutputParser *)0x0;
  bVar3 = err != (OutputParser *)0x0;
  if (out != (OutputParser *)0x0 || err != (OutputParser *)0x0) {
    do {
      iVar1 = cmsysProcess_WaitForData(cp,&local_78,&local_9c,(double *)0x0);
      if (iVar1 == 0) {
        if (bVar2) {
          local_50._M_string_length = 0;
          local_50.field_2._M_local_buf[0] = '\0';
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          cmProcessOutput::DecodeText(&local_9d,&local_50,&local_98,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,
                            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                     local_50.field_2._M_local_buf[0]) + 1);
          }
          if (local_98._M_string_length != 0) {
            (*out->_vptr_OutputParser[2])(out);
          }
        }
        if (bVar3) {
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          cmProcessOutput::DecodeText(&local_9d,&local_70,&local_98,2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,
                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                     local_70.field_2._M_local_buf[0]) + 1);
          }
          if (local_98._M_string_length != 0) {
            (*err->_vptr_OutputParser[2])(err);
          }
        }
        break;
      }
      if ((bool)(bVar2 & iVar1 == 2)) {
        cmProcessOutput::DecodeText(&local_9d,local_78,(long)local_9c,&local_98,1);
        iVar1 = (*out->_vptr_OutputParser[2])
                          (out,local_98._M_dataplus._M_p,local_98._M_string_length & 0xffffffff);
        if ((char)iVar1 == '\0') {
          out = (OutputParser *)0x0;
        }
      }
      else if ((bool)(bVar3 & iVar1 == 3)) {
        cmProcessOutput::DecodeText(&local_9d,local_78,(long)local_9c,&local_98,2);
        iVar1 = (*err->_vptr_OutputParser[2])
                          (err,local_98._M_dataplus._M_p,local_98._M_string_length & 0xffffffff);
        if ((char)iVar1 == '\0') {
          err = (OutputParser *)0x0;
        }
      }
      bVar2 = out != (OutputParser *)0x0;
      bVar3 = err != (OutputParser *)0x0;
    } while (out != (OutputParser *)0x0 || err != (OutputParser *)0x0);
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmProcessTools::RunProcess(struct cmsysProcess_s* cp, OutputParser* out,
                                OutputParser* err, Encoding encoding)
{
  cmsysProcess_Execute(cp);
  char* data = nullptr;
  int length = 0;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((out || err) &&
         (p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (out && p == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      if (!out->Process(strdata.c_str(), static_cast<int>(strdata.size()))) {
        out = nullptr;
      }
    } else if (err && p == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      if (!err->Process(strdata.c_str(), static_cast<int>(strdata.size()))) {
        err = nullptr;
      }
    }
  }
  if (out) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      out->Process(strdata.c_str(), static_cast<int>(strdata.size()));
    }
  }
  if (err) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      err->Process(strdata.c_str(), static_cast<int>(strdata.size()));
    }
  }
  cmsysProcess_WaitForExit(cp, nullptr);
}